

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O3

bool __thiscall raptor::TcpServer::SetExtendInfo(TcpServer *this,ConnectionId cid,uint64_t data)

{
  bool bVar1;
  shared_ptr<raptor::Connection> con;
  IAcceptor local_20;
  IEpollReceiver local_18;
  
  if ((cid == 0xffffffffffffffff) || (this->_magic_number != (uint16_t)(cid >> 0x30))) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if (((int)cid != -1) && (bVar1 = false, (cid & 0xffffffff) < (this->_options).max_connections))
    {
      GetConnection((TcpServer *)&stack0xffffffffffffffe0,(uint32_t)this);
      bVar1 = (Connection *)local_20._vptr_IAcceptor != (Connection *)0x0;
      if (bVar1) {
        Connection::SetExtendInfo((Connection *)local_20._vptr_IAcceptor,data);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._vptr_IEpollReceiver !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._vptr_IEpollReceiver);
      }
    }
  }
  return bVar1;
}

Assistant:

bool TcpServer::SetExtendInfo(ConnectionId cid, uint64_t data) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->SetExtendInfo(data);
        return true;
    }
    return false;
}